

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O0

ValueType * __thiscall
nanovdb::
ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
::getValue(ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
           *this,CoordType *ijk)

{
  bool bVar1;
  CoordValueType dirty_00;
  ValueType *pVVar2;
  ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
  *in_RSI;
  ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
  *in_RDI;
  ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
  *unaff_retaddr;
  CoordValueType dirty;
  undefined4 in_stack_ffffffffffffffe0;
  ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
  *ijk_00;
  InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>
  *in_stack_fffffffffffffff8;
  
  ijk_00 = in_RDI;
  dirty_00 = computeDirty(unaff_retaddr,(CoordType *)in_stack_fffffffffffffff8);
  bVar1 = ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
          ::isCached<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>>(in_RDI,dirty_00);
  if (bVar1) {
    pVVar2 = LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>::getValue
                       ((LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U> *)
                        CONCAT44(dirty_00,in_stack_ffffffffffffffe0),(Coord *)in_RDI);
  }
  else {
    bVar1 = ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
            ::
            isCached<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>>
                      (in_RDI,dirty_00);
    if (bVar1) {
      pVVar2 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
               getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                         ((InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>
                           *)in_stack_fffffffffffffff8,(CoordType *)ijk_00,in_RSI);
    }
    else {
      bVar1 = ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>
              ::
              isCached<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                        (in_RDI,dirty_00);
      if (bVar1) {
        pVVar2 = InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
                 ::
                 getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                           (in_stack_fffffffffffffff8,(CoordType *)ijk_00,in_RSI);
      }
      else {
        pVVar2 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                 ::
                 getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                           ((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                             *)in_stack_fffffffffffffff8,(CoordType *)ijk_00,in_RSI);
      }
    }
  }
  return pVVar2;
}

Assistant:

__hostdev__ const ValueType& getValue(const CoordType& ijk) const
    {
#ifdef USE_SINGLE_ACCESSOR_KEY
        const CoordValueType dirty = this->computeDirty(ijk);
#else
        auto&& dirty = ijk;
#endif
        if (this->isCached<NodeT0>(dirty)) {
            return ((NodeT0*)mNode[0])->getValue(ijk);
        } else if (this->isCached<NodeT1>(dirty)) {
            return ((NodeT1*)mNode[1])->getValueAndCache(ijk, *this);
        } else if (this->isCached<NodeT2>(dirty)) {
            return ((NodeT2*)mNode[2])->getValueAndCache(ijk, *this);
        }
        return ((NodeT3*)mNode[3])->getValueAndCache(ijk, *this);
    }